

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O1

char * which(char *executable,size_t executable_size)

{
  int iVar1;
  char *pcVar2;
  char *__name;
  char *__s;
  size_t __n;
  ulong __size;
  ulong __n_00;
  
  if (1 < executable_size) {
    if ((executable != (char *)0x0) && (*executable == '/')) {
      pcVar2 = strdup(executable);
      return pcVar2;
    }
    pcVar2 = getenv("PATH");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "Environment variable PATH variable was not found";
    }
    else {
      pcVar2 = strdup(pcVar2);
      if (pcVar2 != (char *)0x0) {
        __name = (char *)malloc(0x100);
        if (__name == (char *)0x0) {
          perror("malloc failed");
        }
        else {
          __s = strtok(pcVar2,":");
          if (__s != (char *)0x0) {
            __size = 0x100;
            do {
              __n = strlen(__s);
              __n_00 = executable_size + 1 + __n;
              if (__size < __n_00) {
                __size = __n_00 + 0x80;
                __name = (char *)realloc(__name,__size);
                __n_00 = __size;
                if (__name == (char *)0x0) {
                  perror("realloc");
                  goto LAB_00101e29;
                }
              }
              memset(__name,0,__n_00);
              memcpy(__name,__s,__n);
              __name[__n] = '/';
              memcpy(__name + __n + 1,executable,executable_size);
              iVar1 = access(__name,0);
              if (iVar1 == 0) {
                free(pcVar2);
                return __name;
              }
              __s = strtok((char *)0x0,":");
            } while (__s != (char *)0x0);
          }
          free(pcVar2);
          pcVar2 = __name;
        }
LAB_00101e29:
        free(pcVar2);
        return (char *)0x0;
      }
      pcVar2 = "strdup";
    }
    perror(pcVar2);
  }
  return (char *)0x0;
}

Assistant:

static char *
which (char *executable, size_t executable_size)
{
  char *dir = NULL;
  char *pathname = NULL;
  char *path = NULL;
  size_t pathname_size = 0;
  size_t dir_len = 0;
  size_t alloc_pathname_size = 256;
  const char *org_path;

  if (executable_size <= 1)
    return NULL;
  assert (executable != NULL);

  if (is_absolute_path (executable, executable_size))
    return strdup (executable);

  if (unlikely ((org_path = getenv ("PATH")) == NULL))
    {
      perror ("Environment variable PATH variable was not found");
      return NULL;
    }

  path = strdup (org_path);
  if (unlikely (path == NULL))
    {
      perror ("strdup");
      return NULL;
    }

  /* Pre-allocate memory for pathname */
  if (unlikely ((pathname = malloc (alloc_pathname_size)) == NULL))
    {
      perror ("malloc failed");
      free (path);
      return NULL;
    }

  for (dir = strtok (path, PATH_DELIMITER);
       dir != NULL;
       dir = strtok (NULL, PATH_DELIMITER))
    {
      dir_len = strlen (dir);

      pathname_size = dir_len + DIR_SEPARATOR_LEN + executable_size;

      /* Allocate more memory if needed */
      if (alloc_pathname_size < pathname_size)
        {
          pathname_size += REALLOC_PATHNAME_STEP;
          if (unlikely ((pathname = realloc (pathname, pathname_size)) == NULL))
            {
              perror ("realloc");
              free (path);
              return NULL;
            }
          alloc_pathname_size = pathname_size;
        }

      /* Build pathname */
      memset (pathname, 0, pathname_size);
      memcpy (pathname, dir, dir_len);
      static_assert (DIR_SEPARATOR_LEN == sizeof (char),
                    "DIR_SEPARATOR is expected to be a char");
      pathname[dir_len] = DIR_SEPARATOR;
      memcpy (pathname + dir_len + DIR_SEPARATOR_LEN,
              executable, executable_size);

      if (!access (pathname, F_OK))
        {
          free (path);
          return pathname;
        }
    }

  free (path);
  if (pathname != NULL)
    free (pathname);

  return NULL;
}